

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

xmlCharEncodingHandlerPtr
xmlNewCharEncodingHandler
          (char *name,xmlCharEncodingInputFunc input,xmlCharEncodingOutputFunc output)

{
  int iVar1;
  xmlCharEncodingInputFunc p_Var2;
  char *pcVar3;
  char *up;
  char local_238 [4];
  int i;
  char upper [500];
  char *alias;
  xmlCharEncodingHandlerPtr handler;
  xmlCharEncodingOutputFunc output_local;
  xmlCharEncodingInputFunc input_local;
  char *name_local;
  
  p_Var2 = (xmlCharEncodingInputFunc)xmlGetEncodingAlias(name);
  input_local = (xmlCharEncodingInputFunc)name;
  if (p_Var2 != (xmlCharEncodingInputFunc)0x0) {
    input_local = p_Var2;
  }
  if (input_local == (xmlCharEncodingInputFunc)0x0) {
    name_local = (char *)0x0;
  }
  else {
    for (up._4_4_ = 0; up._4_4_ < 499; up._4_4_ = up._4_4_ + 1) {
      iVar1 = toupper((uint)(byte)input_local[up._4_4_]);
      local_238[up._4_4_] = (char)iVar1;
      if (local_238[up._4_4_] == '\0') break;
    }
    local_238[up._4_4_] = '\0';
    pcVar3 = (*xmlMemStrdup)(local_238);
    if (pcVar3 == (char *)0x0) {
      name_local = (char *)0x0;
    }
    else {
      name_local = (char *)(*xmlMalloc)(0x38);
      if ((xmlCharEncodingHandlerPtr)name_local == (xmlCharEncodingHandlerPtr)0x0) {
        (*xmlFree)(pcVar3);
        name_local = (char *)0x0;
      }
      else {
        memset(name_local,0,0x38);
        (((xmlCharEncodingHandlerPtr)name_local)->input).legacyFunc = input;
        (((xmlCharEncodingHandlerPtr)name_local)->output).legacyFunc = output;
        ((xmlCharEncodingHandlerPtr)name_local)->name = pcVar3;
        ((xmlCharEncodingHandlerPtr)name_local)->flags = 3;
        xmlRegisterCharEncodingHandler((xmlCharEncodingHandlerPtr)name_local);
      }
    }
  }
  return (xmlCharEncodingHandlerPtr)name_local;
}

Assistant:

xmlCharEncodingHandlerPtr
xmlNewCharEncodingHandler(const char *name,
                          xmlCharEncodingInputFunc input,
                          xmlCharEncodingOutputFunc output) {
    xmlCharEncodingHandlerPtr handler;
    const char *alias;
    char upper[500];
    int i;
    char *up = NULL;

    /*
     * Do the alias resolution
     */
    alias = xmlGetEncodingAlias(name);
    if (alias != NULL)
	name = alias;

    /*
     * Keep only the uppercase version of the encoding.
     */
    if (name == NULL)
	return(NULL);
    for (i = 0;i < 499;i++) {
        upper[i] = (char) toupper((unsigned char) name[i]);
	if (upper[i] == 0) break;
    }
    upper[i] = 0;
    up = xmlMemStrdup(upper);
    if (up == NULL)
	return(NULL);

    /*
     * allocate and fill-up an handler block.
     */
    handler = (xmlCharEncodingHandlerPtr)
              xmlMalloc(sizeof(xmlCharEncodingHandler));
    if (handler == NULL) {
        xmlFree(up);
	return(NULL);
    }
    memset(handler, 0, sizeof(xmlCharEncodingHandler));
    handler->input.legacyFunc = input;
    handler->output.legacyFunc = output;
    handler->name = up;
    handler->flags = XML_HANDLER_STATIC | XML_HANDLER_LEGACY;

    /*
     * registers and returns the handler.
     */
    xmlRegisterCharEncodingHandler(handler);
    return(handler);
}